

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

void __thiscall Lexer::error<char_const(&)[30],int&>(Lexer *this,char (*args) [30],int *args_1)

{
  char buf [4096];
  char acStack_1018 [4104];
  
  sprintf(acStack_1018,*args,(ulong)(uint)*args_1);
  printf("%s:%d:%d: %s\n",(this->data).fn._M_dataplus._M_p,(ulong)(uint)(this->reader).pos_.line,
         (ulong)(uint)(this->reader).pos_.col,acStack_1018);
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    std::printf("%s:%d:%d: %s\n",
                data.fn.c_str(),
                reader.pos().line,
                reader.pos().col,
                buf);
    std::exit(1);
  }